

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O1

void la_dgemm_tnos(int m,int n,int k,double *a,int lda,double *b,int ldb,double *c,int ldc)

{
  double *pdVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x14a,
                  "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (b == (double *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x14b,
                  "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (c == (double *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x14c,
                  "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (a == c) {
    __assert_fail("a != c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x14d,
                  "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (b == c) {
    __assert_fail("b != c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x14e,
                  "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (m < 0) {
    __assert_fail("m >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x14f,
                  "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (n < 0) {
    __assert_fail("n >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x150,
                  "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (k < 0) {
    __assert_fail("k >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x151,
                  "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if ((lda < 1) || (lda < m)) {
    __assert_fail("lda >= 1 && lda >= m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x152,
                  "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if ((0 < ldb) && (n <= ldb)) {
    if ((0 < ldc) && (n <= ldc)) {
      if (m != 0) {
        uVar6 = 0;
        do {
          if (n != 0) {
            uVar2 = 0;
            pdVar3 = b;
            do {
              dVar7 = 0.0;
              pdVar1 = a;
              pdVar4 = pdVar3;
              uVar5 = (ulong)(uint)k;
              if (k != 0) {
                do {
                  dVar7 = dVar7 + *pdVar1 * *pdVar4;
                  uVar5 = uVar5 - 1;
                  pdVar1 = pdVar1 + (uint)lda;
                  pdVar4 = pdVar4 + (uint)ldb;
                } while (uVar5 != 0);
              }
              c[uVar6 * (uint)ldc + uVar2] = dVar7;
              uVar2 = uVar2 + 1;
              pdVar3 = pdVar3 + 1;
            } while (uVar2 != (uint)n);
          }
          uVar6 = uVar6 + 1;
          a = a + 1;
        } while (uVar6 != (uint)m);
      }
      return;
    }
    __assert_fail("ldc >= 1 && ldc >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x154,
                  "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  __assert_fail("ldb >= 1 && ldb >= n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x153,
                "void la_dgemm_tnos(int, int, int, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgemm_tnos(
        int m, int n, int k,
        const double *a, int lda,
        const double *b, int ldb,
        double *c, int ldc)
{
    assert(a);
    assert(b);
    assert(c);
    assert(a != c);
    assert(b != c);
    assert(m >= 0);
    assert(n >= 0);
    assert(k >= 0);
    assert(lda >= 1 && lda >= m);
    assert(ldb >= 1 && ldb >= n);
    assert(ldc >= 1 && ldc >= n);

    for (int i_ = 0; i_ < m; i_++) {
        for (int j_ = 0; j_ < n; j_++) {
            double cij = 0.0;
            for (int k_ = 0; k_ < k; k_++) {
                cij += a[k_ * lda + i_] * b[k_ * ldb + j_];
            }
            c[i_ * ldc + j_] = cij;
        }
    }
}